

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
upb::generator::MiniTableMessageVarName_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view full_name)

{
  string local_40;
  generator *pgStack_20;
  string_view full_name_local;
  
  full_name_local._M_len = full_name._M_len;
  pgStack_20 = this;
  full_name_local._M_str = (char *)__return_storage_ptr__;
  (anonymous_namespace)::MangleName_abi_cxx11_(&local_40,(_anonymous_namespace_ *)this,full_name);
  std::operator+(__return_storage_ptr__,&local_40,"_msg_init");
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string MiniTableMessageVarName(absl::string_view full_name) {
  return MangleName(full_name) + "_msg_init";
}